

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O3

uint32_t event_track::find_event_samples
                   (vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                    *emsgs_in,
                   vector<event_track::EventSample,_std::allocator<event_track::EventSample>_>
                   *samples_out,uint64_t segment_start,uint64_t segment_end,bool is_vtt)

{
  long lVar1;
  pointer pEVar2;
  pointer pEVar3;
  long lVar4;
  pointer pDVar5;
  pointer pDVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  EventSample s;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_248;
  value_type local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  DASHEventMessageBoxv1 local_1e0;
  EventMessageInstanceBox local_108;
  
  local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  find_sample_boundaries(emsgs_in,&local_248,segment_start,segment_end);
  if (1 < (int)((ulong)((long)local_248.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_248.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    local_1f0 = &local_108.value_.field_2;
    local_200 = &local_108.scheme_id_uri_.field_2;
    local_1e8 = &local_1e0.value_.field_2;
    local_1f8 = &local_1e0.scheme_id_uri_.field_2;
    lVar7 = 0;
    do {
      local_230.instance_boxes_.
      super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_230.instance_boxes_.
      super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_230.instance_boxes_.
      super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_230.sample_presentation_time_ =
           local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[lVar7];
      lVar1 = lVar7 + 1;
      local_230.sample_duration_ =
           (int)local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7 + 1] -
           (int)local_230.sample_presentation_time_;
      local_230.is_emeb_ = true;
      pDVar5 = (emsgs_in->
               super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pDVar6 = (emsgs_in->
               super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      local_230.is_vtt_ = is_vtt;
      if (pDVar6 != pDVar5) {
        uVar8 = 0;
        uVar10 = 1;
        do {
          if ((pDVar5[uVar8].presentation_time_ <
               local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar1]) &&
             (uVar9 = (ulong)pDVar5[uVar8].event_duration_,
             local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[lVar7] <
             pDVar5[uVar8].presentation_time_ + uVar9 + (ulong)(uVar9 == 0))) {
            DASHEventMessageBoxv1::DASHEventMessageBoxv1(&local_1e0,pDVar5 + uVar8);
            EventMessageInstanceBox::EventMessageInstanceBox
                      (&local_108,&local_1e0,local_230.sample_presentation_time_);
            std::
            vector<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
            ::emplace_back<event_track::EventMessageInstanceBox>
                      (&local_230.instance_boxes_,&local_108);
            local_108.super_full_box.super_box._vptr_box = (_func_int **)&PTR_size_0011baf8;
            if (local_108.message_data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_108.message_data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108.value_._M_dataplus._M_p != local_1f0) {
              operator_delete(local_108.value_._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108.scheme_id_uri_._M_dataplus._M_p != local_200) {
              operator_delete(local_108.scheme_id_uri_._M_dataplus._M_p);
            }
            local_108.super_full_box.super_box._vptr_box = (_func_int **)&PTR_size_0011bb68;
            if (local_108.super_full_box.super_box.box_data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_108.super_full_box.super_box.box_data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108.super_full_box.super_box.box_type_._M_dataplus._M_p !=
                &local_108.super_full_box.super_box.box_type_.field_2) {
              operator_delete(local_108.super_full_box.super_box.box_type_._M_dataplus._M_p);
            }
            local_1e0.super_full_box.super_box._vptr_box = (_func_int **)&PTR_size_0011bab0;
            if (local_1e0.message_data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1e0.message_data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0.value_._M_dataplus._M_p != local_1e8) {
              operator_delete(local_1e0.value_._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0.scheme_id_uri_._M_dataplus._M_p != local_1f8) {
              operator_delete(local_1e0.scheme_id_uri_._M_dataplus._M_p);
            }
            local_1e0.super_full_box.super_box._vptr_box = (_func_int **)&PTR_size_0011bb68;
            if (local_1e0.super_full_box.super_box.box_data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1e0.super_full_box.super_box.box_data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0.super_full_box.super_box.box_type_._M_dataplus._M_p !=
                &local_1e0.super_full_box.super_box.box_type_.field_2) {
              operator_delete(local_1e0.super_full_box.super_box.box_type_._M_dataplus._M_p);
            }
            local_230.is_emeb_ = false;
            pDVar5 = (emsgs_in->
                     super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pDVar6 = (emsgs_in->
                     super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar8 = ((long)pDVar6 - (long)pDVar5 >> 3) * -0x7b425ed097b425ed;
          bVar11 = uVar10 <= uVar8;
          lVar4 = uVar8 - uVar10;
          uVar8 = uVar10;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (bVar11 && lVar4 != 0);
      }
      std::vector<event_track::EventSample,_std::allocator<event_track::EventSample>_>::push_back
                (samples_out,&local_230);
      std::
      vector<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
      ::~vector(&local_230.instance_boxes_);
      lVar7 = lVar1;
    } while (lVar1 < ((long)local_248.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_248.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start) * 0x20000000 + -0x100000000 >> 0x20);
  }
  pEVar2 = (samples_out->
           super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (samples_out->
           super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (int)((ulong)((long)pEVar3 - (long)pEVar2) >> 4) * -0x55555555;
}

Assistant:

uint32_t event_track::find_event_samples(
	const std::vector<event_track::DASHEventMessageBoxv1> &emsgs_in,
	std::vector<event_track::EventSample> &samples_out,
	uint64_t segment_start ,
	uint64_t segment_end, 
	bool is_vtt)
{

	std::vector<uint64_t> sample_boundaries = std::vector<uint64_t>();
	find_sample_boundaries(emsgs_in, sample_boundaries, segment_start, segment_end);

	for (int i = 0; i < (int)sample_boundaries.size() - 1; i++)
	{
		event_track::EventSample s;
		s.sample_presentation_time_ = sample_boundaries[i];
		s.sample_duration_ = (int32_t)((int64_t)sample_boundaries[i + 1] - (int64_t)sample_boundaries[i]);
		
		s.is_emeb_ = true;
		s.is_vtt_ = is_vtt;

		for (unsigned int k = 0; k < emsgs_in.size(); k++)
		{
			uint64_t pt = emsgs_in[k].presentation_time_;
			uint64_t pt_du = emsgs_in[k].presentation_time_ + emsgs_in[k].event_duration_;

			if (emsgs_in[k].event_duration_ == 0)
				pt_du += 1;

			// event is active during sample duration 
			if (pt < sample_boundaries[i+1] && pt_du > sample_boundaries[i])
			{
				s.instance_boxes_.push_back(event_track::EventMessageInstanceBox(emsgs_in[k], s.sample_presentation_time_));
				s.is_emeb_ = false;
			}
		}
		samples_out.push_back(s);
	}

	return (uint32_t)samples_out.size();
}